

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O2

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,PowConstraint *con,double param_2,double param_3,Context ctx)

{
  _Type aiVar1;
  _Type aiVar2;
  Context ctx_00;
  Context CVar3;
  long lVar4;
  Context ctx_local;
  VarArray1 yy;
  VarArray1 xx;
  
  ctx_local = ctx;
  Context::Add(&(con->super_FunctionalConstraint).ctx,ctx);
  aiVar1[0] = (con->
              super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
              args_._M_elems[0];
  aiVar2[0] = (con->
              super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
              args_._M_elems[1];
  lVar4 = (long)aiVar1[0];
  ctx_00.value_ = CTX_MIX;
  CVar3.value_ = ctx_00.value_;
  if (0.0 <= *(double *)(*(long *)(this + 0x40) + lVar4 * 8)) {
    if (0.0 <= *(double *)(*(long *)(this + 0x40) + (long)aiVar2[0] * 8)) {
      if (ctx.value_ < CTX_NEG) {
        ctx.value_ = CTX_POS;
      }
    }
    else if (*(double *)(*(long *)(this + 0x58) + (long)aiVar2[0] * 8) <= 0.0) {
      ctx = Context::operator-(&ctx_local);
    }
    else {
      ctx.value_ = CTX_MIX;
    }
    CVar3.value_ = ctx.value_;
    if (*(double *)(*(long *)(this + 0x58) + lVar4 * 8) <= 1.0) {
      ctx_00 = Context::operator-(&ctx_local);
    }
    else if ((1.0 <= *(double *)(*(long *)(this + 0x40) + lVar4 * 8)) &&
            (ctx_00.value_ = CTX_POS, CTX_POS < ctx_local.value_)) {
      ctx_00.value_ = ctx_local.value_;
    }
  }
  xx._M_elems[0] = (_Type)(_Type)aiVar1[0];
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::PropagateResult2Vars<std::array<int,1ul>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
              *)this,&xx,-INFINITY,INFINITY,CVar3);
  yy._M_elems[0] = (_Type)(_Type)aiVar2[0];
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::PropagateResult2Vars<std::array<int,1ul>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
              *)this,&yy,-INFINITY,INFINITY,ctx_00);
  return;
}

Assistant:

void PropagateResult(
      PowConstraint& con, double , double , Context ctx) {
    con.AddContext(ctx);           // merge context
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    Context ctx_x, ctx_y;
    if (MPCD( lb(x) )>=0.0 ) {     // x >= 0
      ctx_x = (MPCD( lb(y) ) >= 0.0)
                  ? +ctx
                  : MPCD( ub(y) ) <= 0.0
                        ? -ctx: Context::CTX_MIX;
      ctx_y = (MPCD( ub(x) ) <= 1.0)  // 0<=x<=1
                  ? -ctx
                  : MPCD( lb(x) ) >= 1.0  // x>=1
                        ? +ctx
                        : Context::CTX_MIX;
    } else {
      ctx_x = ctx_y = Context::CTX_MIX;
    }
    VarArray1 xx {x};
    PropagateResult2Args(xx,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_x);
    VarArray1 yy {y};
    PropagateResult2Args(yy,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_y);
  }